

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateNotCalledWithExecutionModel
          (BuiltInsValidator *this,int vuid,char *comment,ExecutionModel execution_model,
          Decoration *decoration,Instruction *built_in_inst,Instruction *referenced_inst,
          Instruction *referenced_from_inst)

{
  BuiltIn operand;
  size_type sVar1;
  AssemblyGrammar *pAVar2;
  DiagnosticStream *pDVar3;
  mapped_type *this_00;
  Instruction *inst;
  Instruction *inst_00;
  Instruction *inst_01;
  BuiltInsValidator *local_468;
  code *local_460;
  undefined8 local_458;
  type local_450;
  value_type local_2e8;
  uint32_t local_2c4;
  string local_2c0;
  uint32_t local_29c;
  string local_298;
  string local_278;
  byte local_252;
  allocator<char> local_251;
  string local_250;
  DiagnosticStream local_230;
  char *local_58;
  char *built_in_str;
  char *execution_model_str;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  char *pcStack_30;
  ExecutionModel execution_model_local;
  char *comment_local;
  BuiltInsValidator *pBStack_20;
  int vuid_local;
  BuiltInsValidator *this_local;
  
  execution_model_str = (char *)built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local._4_4_ = execution_model;
  pcStack_30 = comment;
  comment_local._4_4_ = vuid;
  pBStack_20 = this;
  if (this->function_id_ == 0) {
    local_2c4 = Instruction::id(referenced_from_inst);
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_2c4);
    local_460 = ValidateNotCalledWithExecutionModel;
    local_458 = 0;
    local_468 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int&,char_const*&,spv::ExecutionModel&,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_450,(offset_in_BuiltInsValidator_to_subr *)&local_460,&local_468,
               (int *)((long)&comment_local + 4),&stack0xffffffffffffffd0,
               (ExecutionModel *)((long)&decoration_local + 4),(Decoration *)built_in_inst_local,
               (Instruction *)execution_model_str,referenced_from_inst,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,int,char_const*,spv::ExecutionModel,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(int,char_const*,spv::ExecutionModel,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_2e8,&local_450);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,&local_2e8);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_2e8);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_int,_const_char_*,_spv::ExecutionModel,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(int,_const_char_*,_spv::ExecutionModel,_const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_450);
  }
  else {
    sVar1 = std::
            set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
            ::count(&this->execution_models_,(key_type *)((long)&decoration_local + 4));
    if (sVar1 != 0) {
      pAVar2 = ValidationState_t::grammar(this->_);
      built_in_str = AssemblyGrammar::lookupOperandName
                               (pAVar2,SPV_OPERAND_TYPE_EXECUTION_MODEL,decoration_local._4_4_);
      pAVar2 = ValidationState_t::grammar(this->_);
      operand = Decoration::builtin((Decoration *)built_in_inst_local);
      local_58 = AssemblyGrammar::lookupOperandName(pAVar2,SPV_OPERAND_TYPE_BUILT_IN,operand);
      ValidationState_t::diag(&local_230,this->_,SPV_ERROR_INVALID_DATA,referenced_from_inst);
      local_252 = 0;
      if ((int)comment_local._4_4_ < 0) {
        std::allocator<char>::allocator();
        local_252 = 1;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_251);
      }
      else {
        ValidationState_t::VkErrorID_abi_cxx11_(&local_250,this->_,comment_local._4_4_,(char *)0x0);
      }
      pDVar3 = DiagnosticStream::operator<<(&local_230,&local_250);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&stack0xffffffffffffffd0);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x3e7969);
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_278,(_anonymous_namespace_ *)referenced_inst,inst);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_278);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [13])" depends on ");
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_298,(_anonymous_namespace_ *)execution_model_str,inst_00);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_298);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [34])" which is decorated with BuiltIn ");
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_58);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x3cdc5b);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [6])" Id <");
      local_29c = Instruction::id(referenced_inst);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_29c);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [26])"> is later referenced by ");
      (anonymous_namespace)::GetIdDesc_abi_cxx11_
                (&local_2c0,(_anonymous_namespace_ *)referenced_from_inst,inst_01);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_2c0);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [15])" in function <");
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&this->function_id_);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [40])"> which is called with execution model ");
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&built_in_str);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0x3cdc5b);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_250);
      if ((local_252 & 1) != 0) {
        std::allocator<char>::~allocator(&local_251);
      }
      DiagnosticStream::~DiagnosticStream(&local_230);
      return this_local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateNotCalledWithExecutionModel(
    int vuid, const char* comment, spv::ExecutionModel execution_model,
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (function_id_) {
    if (execution_models_.count(execution_model)) {
      const char* execution_model_str = _.grammar().lookupOperandName(
          SPV_OPERAND_TYPE_EXECUTION_MODEL, uint32_t(execution_model));
      const char* built_in_str = _.grammar().lookupOperandName(
          SPV_OPERAND_TYPE_BUILT_IN, (uint32_t)decoration.builtin());
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << (vuid < 0 ? std::string("") : _.VkErrorID(vuid)) << comment
             << " " << GetIdDesc(referenced_inst) << " depends on "
             << GetIdDesc(built_in_inst) << " which is decorated with BuiltIn "
             << built_in_str << "."
             << " Id <" << referenced_inst.id() << "> is later referenced by "
             << GetIdDesc(referenced_from_inst) << " in function <"
             << function_id_ << "> which is called with execution model "
             << execution_model_str << ".";
    }
  } else {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateNotCalledWithExecutionModel, this,
                  vuid, comment, execution_model, decoration, built_in_inst,
                  referenced_from_inst, std::placeholders::_1));
  }
  return SPV_SUCCESS;
}